

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::filename(path *__return_storage_ptr__,path *this)

{
  iterator local_90;
  path local_50;
  const_iterator local_30;
  const_iterator local_28;
  const_iterator local_20;
  
  relative_path(&local_50,this);
  if (local_50._path._M_string_length == 0) {
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  }
  else {
    local_20._M_current = (this->_path)._M_dataplus._M_p;
    local_30._M_current = local_20._M_current + (this->_path)._M_string_length;
    local_28._M_current = local_30._M_current;
    iterator::iterator(&local_90,&local_20,&local_28,&local_30);
    local_90._iter = iterator::decrement(&local_90,&local_90._iter);
    iterator::updateCurrent(&local_90);
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_90._current._path._M_dataplus._M_p,
               local_90._current._path._M_dataplus._M_p + local_90._current._path._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._current._path._M_dataplus._M_p != &local_90._current._path.field_2) {
      operator_delete(local_90._current._path._M_dataplus._M_p,
                      local_90._current._path.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._path._M_dataplus._M_p != &local_50._path.field_2) {
    operator_delete(local_50._path._M_dataplus._M_p,local_50._path.field_2._M_allocated_capacity + 1
                   );
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::filename() const
{
    return relative_path().empty() ? path() : path(*--end());
}